

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_zipx_xz(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint64_t request;
  wchar_t wVar1;
  size_t local_68;
  ssize_t to_consume;
  ssize_t in_bytes;
  ssize_t bytes_avail;
  void *compressed_buf;
  lzma_ret lz_ret;
  wchar_t ret;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  _lz_ret = (zip *)a->format->data;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (_lz_ret->decompress_init == '\0') {
    wVar1 = zipx_xz_init(a,_lz_ret);
    if (wVar1 != L'\0') {
      return wVar1;
    }
    compressed_buf._4_4_ = 0;
  }
  bytes_avail = (ssize_t)__archive_read_ahead((archive_read *)buff_local,1,&in_bytes);
  if (-1 < in_bytes) {
    if (_lz_ret->entry_bytes_remaining < in_bytes) {
      local_68 = _lz_ret->entry_bytes_remaining;
    }
    else {
      local_68 = in_bytes;
    }
    (_lz_ret->zipx_lzma_stream).next_in = (uint8_t *)bytes_avail;
    (_lz_ret->zipx_lzma_stream).avail_in = local_68;
    (_lz_ret->zipx_lzma_stream).total_in = 0;
    (_lz_ret->zipx_lzma_stream).next_out = _lz_ret->uncompressed_buffer;
    (_lz_ret->zipx_lzma_stream).avail_out = _lz_ret->uncompressed_buffer_size;
    (_lz_ret->zipx_lzma_stream).total_out = 0;
    compressed_buf._0_4_ = lzma_code(&_lz_ret->zipx_lzma_stream,LZMA_RUN);
    switch((lzma_ret)compressed_buf) {
    case LZMA_OK:
    case LZMA_NO_CHECK:
      break;
    case LZMA_STREAM_END:
      lzma_end(&_lz_ret->zipx_lzma_stream);
      _lz_ret->zipx_lzma_valid = '\0';
      if ((_lz_ret->zipx_lzma_stream).total_in != _lz_ret->entry_bytes_remaining) {
        archive_set_error((archive *)buff_local,-1,"xz premature end of stream");
        return L'\xffffffe2';
      }
      _lz_ret->end_of_entry = '\x01';
      break;
    default:
      archive_set_error((archive *)buff_local,-1,"xz unknown error %d",
                        (ulong)(lzma_ret)compressed_buf);
      return L'\xffffffe2';
    case LZMA_DATA_ERROR:
      archive_set_error((archive *)buff_local,-1,"xz data error (error %d)",
                        (ulong)(lzma_ret)compressed_buf);
      return L'\xffffffe2';
    }
    request = (_lz_ret->zipx_lzma_stream).total_in;
    __archive_read_consume((archive_read *)buff_local,request);
    _lz_ret->entry_bytes_remaining = _lz_ret->entry_bytes_remaining - request;
    _lz_ret->entry_compressed_bytes_read = request + _lz_ret->entry_compressed_bytes_read;
    _lz_ret->entry_uncompressed_bytes_read =
         (_lz_ret->zipx_lzma_stream).total_out + _lz_ret->entry_uncompressed_bytes_read;
    *offset_local = (_lz_ret->zipx_lzma_stream).total_out;
    *size_local = (size_t)_lz_ret->uncompressed_buffer;
    a_local._4_4_ = consume_optional_marker((archive_read *)buff_local,_lz_ret);
    if (a_local._4_4_ == L'\0') {
      a_local._4_4_ = L'\0';
    }
    return a_local._4_4_;
  }
  archive_set_error((archive *)buff_local,0x54,"Truncated xz file body");
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_xz(struct archive_read *a, const void **buff,
	size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume = 0;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_xz_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated xz file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out = zip->uncompressed_buffer_size;
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_NO_CHECK:
		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;

			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xz premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;
	}

	to_consume = zip->zipx_lzma_stream.total_in;

	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	*size = zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}